

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode cpool_add_pollfds(cpool *cpool,curl_pollfds *cpfds)

{
  CURLcode CVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn_00;
  connectdata *conn;
  easy_pollset ps;
  Curl_llist_node *e;
  CURLcode result;
  curl_pollfds *cpfds_local;
  cpool *cpool_local;
  
  pCVar2 = Curl_llist_head(&cpool->shutdowns);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (ps._24_8_ = Curl_llist_head(&cpool->shutdowns); ps._24_8_ != 0;
        ps._24_8_ = Curl_node_next((Curl_llist_node *)ps._24_8_)) {
      conn_00 = (connectdata *)Curl_node_elem((Curl_llist_node *)ps._24_8_);
      memset(&conn,0,0x20);
      Curl_attach_connection(cpool->idata,conn_00);
      Curl_conn_adjust_pollset(cpool->idata,(easy_pollset *)&conn);
      Curl_detach_connection(cpool->idata);
      CVar1 = Curl_pollfds_add_ps(cpfds,(easy_pollset *)&conn);
      if (CVar1 != CURLE_OK) {
        Curl_pollfds_cleanup(cpfds);
        return CVar1;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cpool_add_pollfds(struct cpool *cpool,
                                  struct curl_pollfds *cpfds)
{
  CURLcode result = CURLE_OK;

  if(Curl_llist_head(&cpool->shutdowns)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cpool->shutdowns); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(cpool->idata, conn);
      Curl_conn_adjust_pollset(cpool->idata, &ps);
      Curl_detach_connection(cpool->idata);

      result = Curl_pollfds_add_ps(cpfds, &ps);
      if(result) {
        Curl_pollfds_cleanup(cpfds);
        goto out;
      }
    }
  }
out:
  return result;
}